

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O3

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateState
          (HtmlparserCppTest *this,string *expected_state)

{
  HtmlParser *source;
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  HtmlparserCppTest *pHVar5;
  undefined8 extraout_RAX;
  long lVar6;
  HtmlparserCppTest *pHVar7;
  HtmlparserCppTest *pHVar8;
  HtmlparserCppTest *pHVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  char *extraout_RAX_00;
  HtmlparserCppTest *pHVar10;
  char *extraout_RAX_01;
  char *extraout_RAX_02;
  int *piVar11;
  HtmlParser *this_00;
  const_iterator cVar12;
  mapped_type *ppHVar13;
  undefined8 extraout_RAX_03;
  undefined7 uVar15;
  HtmlparserCppTest *pHVar14;
  ulong uVar16;
  htmlparser_ctx *phVar17;
  undefined1 *puVar18;
  undefined1 *puVar19;
  htmlparser_ctx_s *phVar20;
  _Base_ptr p_Var21;
  _Base_ptr p_Var22;
  pointer this_01;
  _Base_ptr unaff_R12;
  HtmlparserCppTest *unaff_R14;
  pointer str_00;
  _Base_ptr unaff_R15;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_248;
  HtmlparserCppTest *pHStack_230;
  _Base_ptr p_Stack_228;
  undefined1 auStack_1e8 [16];
  _Base_ptr p_Stack_1d8;
  HtmlparserCppTest *pHStack_1d0;
  _Base_ptr p_Stack_1c8;
  undefined1 auStack_1c0 [16];
  _Base_ptr p_Stack_1b0;
  HtmlparserCppTest *pHStack_1a8;
  _Base_ptr p_Stack_1a0;
  char *pcStack_198;
  HtmlParser HStack_190;
  allocator aStack_151;
  HtmlparserCppTest *pHStack_150;
  size_t sStack_148;
  HtmlparserCppTest HStack_140;
  HtmlparserCppTest *pHStack_100;
  ulong uStack_f8;
  HtmlparserCppTest *pHStack_e8;
  allocator aStack_d1;
  HtmlparserCppTest *pHStack_d0;
  size_t sStack_c8;
  undefined1 auStack_c0 [40];
  HtmlparserCppTest *pHStack_98;
  HtmlParser HStack_90;
  HtmlparserCppTest HStack_88;
  undefined8 uStack_50;
  string *psStack_48;
  HtmlparserCppTest *pHStack_40;
  allocator local_31;
  HtmlparserCppTest *local_30;
  size_t local_28;
  
  pHVar14 = (HtmlparserCppTest *)(this->parser_).parser_;
  pHStack_40 = (HtmlparserCppTest *)0x106f4f;
  iVar4 = ctemplate_htmlparser::htmlparser_state((htmlparser_ctx_s *)pHVar14);
  puVar18 = kStateMap;
  pHStack_40 = (HtmlparserCppTest *)0x106f5d;
  pHVar5 = (HtmlparserCppTest *)IdToName(pHVar14,(IdNameMap *)kStateMap,iVar4);
  if (expected_state->_M_string_length == 0) {
    pHStack_40 = (HtmlparserCppTest *)0x106fcd;
    ValidateState();
  }
  else {
    pHVar14 = (HtmlparserCppTest *)&local_30;
    pHStack_40 = (HtmlparserCppTest *)0x106f79;
    std::__cxx11::string::string((string *)pHVar14,(char *)pHVar5,&local_31);
    sVar2 = expected_state->_M_string_length;
    puVar18 = (undefined1 *)pHVar5;
    if (sVar2 == local_28) {
      uVar15 = (undefined7)((ulong)expected_state >> 8);
      if (sVar2 == 0) {
        expected_state = (string *)CONCAT71(uVar15,1);
      }
      else {
        pHVar14 = (HtmlparserCppTest *)(expected_state->_M_dataplus)._M_p;
        pHStack_40 = (HtmlparserCppTest *)0x106f98;
        puVar18 = (undefined1 *)local_30;
        iVar4 = bcmp(pHVar14,local_30,sVar2);
        expected_state = (string *)CONCAT71(uVar15,iVar4 == 0);
      }
    }
    else {
      expected_state = (string *)0x0;
    }
    if (local_30 != (HtmlparserCppTest *)&stack0xffffffffffffffe0) {
      pHStack_40 = (HtmlparserCppTest *)0x106fbc;
      pHVar14 = local_30;
      operator_delete(local_30);
    }
    unaff_R14 = local_30;
    if ((char)expected_state != '\0') {
      return;
    }
  }
  pHStack_40 = (HtmlparserCppTest *)ValidateTag;
  ValidateState();
  pHStack_40 = unaff_R14;
  psStack_48 = expected_state;
  uStack_50 = extraout_RAX;
  pHVar5 = (HtmlparserCppTest *)(pHVar14->parser_).parser_;
  HStack_88.parser_.parser_ = (htmlparser_ctx *)0x106fe5;
  pHVar7 = (HtmlparserCppTest *)puVar18;
  lVar6 = ctemplate_htmlparser::htmlparser_tag((htmlparser_ctx_s *)pHVar5);
  if (lVar6 == 0) {
    HStack_88.parser_.parser_ = (htmlparser_ctx *)0x10700f;
    ValidateTag();
  }
  else {
    HStack_88.parser_.parser_ = (htmlparser_ctx *)0x106ff3;
    pHVar7 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_tag((pHVar14->parser_).parser_);
    HStack_88.parser_.parser_ = (htmlparser_ctx *)0x106ffe;
    pHVar5 = (HtmlparserCppTest *)puVar18;
    iVar4 = std::__cxx11::string::compare(puVar18);
    if (iVar4 == 0) {
      return;
    }
  }
  HStack_88.parser_.parser_ = (htmlparser_ctx *)ValidateAttribute;
  ValidateTag();
  pHVar10 = (HtmlparserCppTest *)(pHVar5->parser_).parser_;
  HStack_88.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107027;
  pHVar8 = pHVar7;
  HStack_88.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)puVar18;
  HStack_88.parser_.parser_ = (htmlparser_ctx *)pHVar14;
  lVar6 = ctemplate_htmlparser::htmlparser_attr((htmlparser_ctx_s *)pHVar10);
  if (lVar6 == 0) {
    HStack_88.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107051;
    ValidateAttribute();
  }
  else {
    HStack_88.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107035;
    pHVar8 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_attr((pHVar5->parser_).parser_);
    HStack_88.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107040;
    pHVar10 = pHVar7;
    iVar4 = std::__cxx11::string::compare((char *)pHVar7);
    if (iVar4 == 0) {
      return;
    }
  }
  HStack_88.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)ValidateValue;
  ValidateAttribute();
  pHVar14 = (HtmlparserCppTest *)(pHVar10->parser_).parser_;
  auStack_c0._24_8_ = (_Base_ptr)0x10706c;
  pHVar9 = pHVar8;
  HStack_88.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pHVar7;
  HStack_88.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pHVar5;
  lVar6 = ctemplate_htmlparser::htmlparser_value((htmlparser_ctx_s *)pHVar14);
  if (lVar6 != 0) {
    auStack_c0._24_8_ = (_Base_ptr)0x10707a;
    pHVar9 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_value((pHVar10->parser_).parser_)
    ;
    auStack_c0._24_8_ = (_Base_ptr)0x10708f;
    pHVar14 = (HtmlparserCppTest *)&pHStack_98;
    std::__cxx11::string::string
              ((string *)&pHStack_98,(char *)pHVar9,(allocator *)(auStack_c0 + 0x27));
    phVar17 = *(htmlparser_ctx **)&(pHVar8->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header
    ;
    pHVar10 = (HtmlparserCppTest *)&pHStack_98;
    if (phVar17 == HStack_90.parser_) {
      if (phVar17 == (htmlparser_ctx *)0x0) {
LAB_001070b2:
        if (pHStack_98 != &HStack_88) {
          auStack_c0._24_8_ = (_Base_ptr)0x1070c4;
          operator_delete(pHStack_98);
        }
        return;
      }
      pHVar14 = *(HtmlparserCppTest **)&(pHVar8->contextMap)._M_t._M_impl;
      auStack_c0._24_8_ = (_Base_ptr)0x1070ae;
      pHVar9 = pHStack_98;
      iVar4 = bcmp(pHVar14,pHStack_98,(size_t)phVar17);
      pHVar10 = pHStack_98;
      if (iVar4 == 0) goto LAB_001070b2;
    }
    auStack_c0._24_8_ = (_Base_ptr)0x1070d1;
    ValidateValue();
  }
  auStack_c0._24_8_ = ValidateAttributeType;
  ValidateValue();
  auStack_c0._24_8_ = pHVar10;
  auStack_c0._16_8_ = pHVar8;
  pHVar14 = (HtmlparserCppTest *)(pHVar14->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_attr_type((htmlparser_ctx_s *)pHVar14);
  puVar18 = kAttributeTypeMap;
  pHVar5 = (HtmlparserCppTest *)IdToName(pHVar14,(IdNameMap *)kAttributeTypeMap,iVar4);
  if (*(long *)&(pHVar9->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
    ValidateAttributeType();
  }
  else {
    pHVar14 = (HtmlparserCppTest *)&pHStack_d0;
    std::__cxx11::string::string((string *)pHVar14,(char *)pHVar5,&aStack_d1);
    sVar2 = *(size_t *)&(pHVar9->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    puVar18 = (undefined1 *)pHVar5;
    if (sVar2 == sStack_c8) {
      uVar15 = (undefined7)((ulong)pHVar9 >> 8);
      if (sVar2 == 0) {
        pHVar9 = (HtmlparserCppTest *)CONCAT71(uVar15,1);
      }
      else {
        pHVar14 = *(HtmlparserCppTest **)&(pHVar9->contextMap)._M_t._M_impl;
        puVar18 = (undefined1 *)pHStack_d0;
        iVar4 = bcmp(pHVar14,pHStack_d0,sVar2);
        pHVar9 = (HtmlparserCppTest *)CONCAT71(uVar15,iVar4 == 0);
      }
    }
    else {
      pHVar9 = (HtmlparserCppTest *)0x0;
    }
    if (pHStack_d0 != (HtmlparserCppTest *)auStack_c0) {
      pHVar14 = pHStack_d0;
      operator_delete(pHStack_d0);
    }
    pHVar10 = pHStack_d0;
    if ((char)pHVar9 != '\0') {
      return;
    }
  }
  ValidateAttributeType();
  uStack_f8 = 0x10717a;
  pHStack_e8 = pHVar9;
  bVar3 = StringToBool((string *)puVar18);
  uVar16 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
  phVar20 = (pHVar14->parser_).parser_;
  uStack_f8 = 0x107185;
  iVar4 = ctemplate_htmlparser::htmlparser_is_attr_quoted(phVar20);
  if (SUB81(uVar16,0) == (iVar4 != 0)) {
    return;
  }
  uStack_f8 = 0x10719b;
  ValidateAttributeQuoted();
  HStack_140.parser_.parser_ = (htmlparser_ctx *)0x1071aa;
  pHStack_100 = pHVar14;
  uStack_f8 = uVar16;
  bVar3 = StringToBool((string *)puVar18);
  phVar17 = (htmlparser_ctx *)(CONCAT71(extraout_var_00,bVar3) & 0xffffffff);
  p_Var21 = *(_Base_ptr *)(phVar20 + 0x30);
  HStack_140.parser_.parser_ = (htmlparser_ctx *)0x1071b5;
  iVar4 = ctemplate_htmlparser::htmlparser_in_js((htmlparser_ctx_s *)p_Var21);
  if (SUB81(phVar17,0) == (iVar4 != 0)) {
    return;
  }
  HStack_140.parser_.parser_ = (htmlparser_ctx *)0x1071cb;
  ValidateInJavascript();
  HStack_140.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071da;
  HStack_140.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)phVar20;
  HStack_140.parser_.parser_ = phVar17;
  bVar3 = StringToBool((string *)puVar18);
  p_Var22 = p_Var21[1]._M_left;
  HStack_140.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071e5;
  iVar4 = ctemplate_htmlparser::htmlparser_is_js_quoted((htmlparser_ctx_s *)p_Var22);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  HStack_140.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071fb;
  ValidateJavascriptQuoted();
  pHVar14 = (HtmlparserCppTest *)p_Var22[1]._M_left;
  HStack_140.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var21;
  HStack_140.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pHVar10;
  iVar4 = ctemplate_htmlparser::htmlparser_js_state((htmlparser_ctx_s *)pHVar14);
  puVar19 = kJavascriptStateMap;
  pHVar5 = (HtmlparserCppTest *)IdToName(pHVar14,(IdNameMap *)kJavascriptStateMap,iVar4);
  if (*(long *)&(((HtmlparserCppTest *)puVar18)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    ValidateJavascriptState();
  }
  else {
    pHVar14 = (HtmlparserCppTest *)&pHStack_150;
    std::__cxx11::string::string((string *)pHVar14,(char *)pHVar5,&aStack_151);
    sVar2 = *(size_t *)
             &(((HtmlparserCppTest *)puVar18)->contextMap)._M_t._M_impl.super__Rb_tree_header.
              _M_header;
    puVar19 = (undefined1 *)pHVar5;
    if (sVar2 == sStack_148) {
      if (sVar2 == 0) {
        bVar3 = true;
      }
      else {
        pHVar14 = *(HtmlparserCppTest **)&(((HtmlparserCppTest *)puVar18)->contextMap)._M_t._M_impl;
        puVar19 = (undefined1 *)pHStack_150;
        iVar4 = bcmp(pHVar14,pHStack_150,sVar2);
        bVar3 = iVar4 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if (pHStack_150 != &HStack_140) {
      pHVar14 = pHStack_150;
      operator_delete(pHStack_150);
    }
    pHVar10 = pHStack_150;
    if (bVar3) {
      return;
    }
  }
  ValidateJavascriptState();
  bVar3 = StringToBool((string *)puVar19);
  pHVar5 = (HtmlparserCppTest *)(pHVar14->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_in_css((htmlparser_ctx_s *)pHVar5);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  ValidateInCss();
  pHVar8 = (HtmlparserCppTest *)&pcStack_198;
  pHVar7 = pHVar5;
  HStack_190.parser_ = (htmlparser_ctx *)pHVar14;
  if (*(long *)&(((HtmlparserCppTest *)puVar19)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
LAB_00107324:
    pHVar8 = (HtmlparserCppTest *)puVar19;
    p_Stack_1a0 = (_Base_ptr)0x107329;
    ValidateLine();
  }
  else {
    p_Stack_1a0 = (_Base_ptr)0x1072dc;
    pcStack_198 = extraout_RAX_00;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    pHVar7 = *(HtmlparserCppTest **)&(((HtmlparserCppTest *)puVar19)->contextMap)._M_t._M_impl;
    p_Stack_1a0 = (_Base_ptr)0x1072f8;
    pHVar10 = (HtmlparserCppTest *)strtol((char *)pHVar7,&pcStack_198,10);
    pHVar14 = pHVar5;
    puVar19 = (undefined1 *)pHVar8;
    unaff_R12 = (_Base_ptr)&pcStack_198;
    if ((*pcStack_198 != '\0') ||
       (unaff_R12 = (_Base_ptr)&pcStack_198, unaff_R15->_M_color != _S_red)) goto LAB_00107324;
    pHVar7 = (HtmlparserCppTest *)(pHVar5->parser_).parser_;
    p_Stack_1a0 = (_Base_ptr)0x107313;
    iVar4 = ctemplate_htmlparser::htmlparser_get_line_number((htmlparser_ctx_s *)pHVar7);
    unaff_R12 = (_Base_ptr)&pcStack_198;
    if (iVar4 == (int)pHVar10) {
      return;
    }
  }
  p_Stack_1a0 = (_Base_ptr)ValidateColumn;
  ValidateLine();
  p_Stack_1a0 = unaff_R15;
  pHStack_1a8 = pHVar10;
  p_Stack_1b0 = unaff_R12;
  auStack_1c0._8_8_ = pHVar14;
  pHVar9 = (HtmlparserCppTest *)auStack_1c0;
  auStack_1c0._0_8_ = extraout_RAX_01;
  pHVar5 = pHVar7;
  if (*(long *)&(pHVar8->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
LAB_00107390:
    pHVar9 = pHVar8;
    p_Stack_1c8 = (_Base_ptr)0x107395;
    ValidateColumn();
  }
  else {
    p_Stack_1c8 = (_Base_ptr)0x107348;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    pHVar5 = *(HtmlparserCppTest **)&(pHVar8->contextMap)._M_t._M_impl;
    p_Stack_1c8 = (_Base_ptr)0x107364;
    pHVar10 = (HtmlparserCppTest *)strtol((char *)pHVar5,(char **)auStack_1c0,10);
    pHVar14 = pHVar7;
    pHVar8 = pHVar9;
    unaff_R12 = (_Base_ptr)auStack_1c0;
    if ((*(char *)auStack_1c0._0_8_ != '\0') ||
       (unaff_R12 = (_Base_ptr)auStack_1c0, unaff_R15->_M_color != _S_red)) goto LAB_00107390;
    pHVar5 = (HtmlparserCppTest *)(pHVar7->parser_).parser_;
    p_Stack_1c8 = (_Base_ptr)0x10737f;
    iVar4 = ctemplate_htmlparser::htmlparser_get_column_number((htmlparser_ctx_s *)pHVar5);
    unaff_R12 = (_Base_ptr)auStack_1c0;
    if (iVar4 == (int)pHVar10) {
      return;
    }
  }
  p_Stack_1c8 = (_Base_ptr)ValidateValueIndex;
  ValidateColumn();
  p_Stack_1c8 = unaff_R15;
  pHStack_1d0 = pHVar10;
  p_Stack_1d8 = unaff_R12;
  auStack_1e8._8_8_ = pHVar14;
  pHVar7 = (HtmlparserCppTest *)auStack_1e8;
  auStack_1e8._0_8_ = extraout_RAX_02;
  pHVar14 = pHVar5;
  if (*(long *)&(pHVar9->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header != 0) {
    piVar11 = __errno_location();
    *piVar11 = 0;
    pHVar14 = *(HtmlparserCppTest **)&(pHVar9->contextMap)._M_t._M_impl;
    lVar6 = strtol((char *)pHVar14,(char **)auStack_1e8,10);
    pHVar9 = pHVar7;
    unaff_R12 = (_Base_ptr)auStack_1e8;
    if ((*(char *)auStack_1e8._0_8_ == '\0') && (unaff_R12 = (_Base_ptr)auStack_1e8, *piVar11 == 0))
    {
      pHVar14 = (HtmlparserCppTest *)(pHVar5->parser_).parser_;
      iVar4 = ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)pHVar14);
      unaff_R12 = (_Base_ptr)auStack_1e8;
      if (iVar4 == (int)lVar6) {
        return;
      }
      goto LAB_00107401;
    }
  }
  pHVar7 = pHVar9;
  ValidateValueIndex();
LAB_00107401:
  ValidateValueIndex();
  bVar3 = StringToBool((string *)pHVar7);
  pHVar5 = (HtmlparserCppTest *)(pHVar14->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)pHVar5);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  ValidateIsUrlStart();
  vStack_248.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_248.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_248.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHStack_230 = pHVar14;
  p_Stack_228 = unaff_R12;
  SplitStringIntoKeyValuePairs((string *)pHVar7,"=",",",&vStack_248);
  if (vStack_248.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_248.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    source = &pHVar5->parser_;
    p_Var1 = &(pHVar5->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_248.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar4 = std::__cxx11::string::compare((char *)str_00);
      if (iVar4 == 0) {
        ValidateState(pHVar5,str);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)str_00);
        if (iVar4 == 0) {
          ValidateTag(pHVar5,str);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)str_00);
          if (iVar4 == 0) {
            ValidateAttribute(pHVar5,str);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)str_00);
            if (iVar4 == 0) {
              ValidateValue(pHVar5,str);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)str_00);
              if (iVar4 == 0) {
                ValidateAttributeType(pHVar5,str);
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)str_00);
                if (iVar4 == 0) {
                  ValidateAttributeQuoted(pHVar5,str);
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar4 == 0) {
                    ValidateInJavascript(pHVar5,str);
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar4 == 0) {
                      ValidateJavascriptQuoted(pHVar5,str);
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar4 == 0) {
                        ValidateJavascriptState(pHVar5,str);
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar4 == 0) {
                          ValidateInCss(pHVar5,str);
                        }
                        else {
                          iVar4 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar4 == 0) {
                            ValidateLine(pHVar5,str);
                          }
                          else {
                            iVar4 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar4 == 0) {
                              ValidateColumn(pHVar5,str);
                            }
                            else {
                              iVar4 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar4 == 0) {
                                ValidateValueIndex(pHVar5,str);
                              }
                              else {
                                iVar4 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar4 == 0) {
                                  ValidateIsUrlStart(pHVar5,str);
                                }
                                else {
                                  iVar4 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar4 == 0) {
                                    cVar12 = std::
                                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                             ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar5,str);
                                    if ((_Rb_tree_header *)cVar12._M_node == p_Var1) {
                                      this_00 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_00);
                                      ppHVar13 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar5->contextMap,str);
                                      *ppHVar13 = this_00;
                                    }
                                    ppHVar13 = std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::operator[](&pHVar5->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar13,source);
                                  }
                                  else {
                                    iVar4 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar4 == 0) {
                                      cVar12 = std::
                                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar5,str);
                                      if ((_Rb_tree_header *)cVar12._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_00107851:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_248);
                                        _Unwind_Resume(extraout_RAX_03);
                                      }
                                      ppHVar13 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar5->contextMap,str);
                                      HtmlParser::CopyFrom(source,*ppHVar13);
                                    }
                                    else {
                                      iVar4 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar4 == 0) {
                                        bVar3 = StringToBool(str);
                                        if (bVar3) {
                                          ctemplate_htmlparser::htmlparser_reset(source->parser_);
                                        }
                                      }
                                      else {
                                        this_01 = str_00;
                                        iVar4 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar4 == 0) {
                                          iVar4 = NameToId((HtmlparserCppTest *)this_01,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    (source->parser_,iVar4);
                                        }
                                        else {
                                          iVar4 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar4 != 0) goto LAB_00107851;
                                          bVar3 = StringToBool(str);
                                          if (bVar3) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      (source->parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_248.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_248);
  return;
}

Assistant:

void HtmlparserCppTest::ValidateState(const string &expected_state) {
  const char* parsed_state = IdToName(kStateMap, parser_.state());
  EXPECT_TRUE(parsed_state != NULL);
  EXPECT_TRUE(!expected_state.empty());
  EXPECT_EQ(expected_state, string(parsed_state))
      << "Unexpected state at line " << parser_.line_number();
}